

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O2

UniValue * JSONRPCError(UniValue *__return_storage_ptr__,int code,string *message)

{
  string str;
  string key;
  string key_00;
  long in_FS_OFFSET;
  undefined4 uStack_138;
  int code_local;
  undefined1 local_130 [24];
  UniValue in_stack_fffffffffffffee8;
  UniValue local_b8;
  string local_60 [32];
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = local_30;
  local_38 = 0;
  local_30[0] = 0;
  str._M_dataplus._M_p._4_4_ = code;
  str._M_dataplus._M_p._0_4_ = uStack_138;
  str._8_24_ = local_130;
  code_local = code;
  UniValue::UniValue(__return_storage_ptr__,VOBJ,str);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            (local_60,"code",(allocator<char> *)((long)&uStack_138 + 3));
  UniValue::UniValue<int_&,_int,_true>(&local_b8,&code_local);
  key._M_dataplus._M_p._4_4_ = code_local;
  key._M_dataplus._M_p._0_4_ = uStack_138;
  key._M_string_length = local_130._0_8_;
  key.field_2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 )local_130._8_16_;
  UniValue::pushKV(__return_storage_ptr__,key,in_stack_fffffffffffffee8);
  UniValue::~UniValue(&local_b8);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffff28,"message",(allocator<char> *)((long)&uStack_138 + 3)
            );
  UniValue::
  UniValue<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ((UniValue *)local_130,message);
  key_00._M_dataplus._M_p._4_4_ = code_local;
  key_00._M_dataplus._M_p._0_4_ = uStack_138;
  key_00._M_string_length = local_130._0_8_;
  key_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )local_130._8_16_;
  UniValue::pushKV(__return_storage_ptr__,key_00,in_stack_fffffffffffffee8);
  UniValue::~UniValue((UniValue *)local_130);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue JSONRPCError(int code, const std::string& message)
{
    UniValue error(UniValue::VOBJ);
    error.pushKV("code", code);
    error.pushKV("message", message);
    return error;
}